

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

string * __thiscall
ninx::lexer::token::Text::dump_abi_cxx11_(string *__return_storage_ptr__,Text *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"TEXT: \'",&this->text);
  std::operator+(__return_storage_ptr__,&local_30,"\'");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Text::dump() const {
    return "TEXT: '" + this->get_text() + "'";
}